

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleARGBFilterCols_C(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  for (lVar3 = 0; iVar4 = x >> 0x10, (int)lVar3 < dst_width + -1; lVar3 = lVar3 + 2) {
    uVar5 = (uint)x >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)iVar4 * 4);
    uVar2 = *(uint *)(src_argb + (long)iVar4 * 4 + 4);
    uVar6 = uVar5 ^ 0x7f;
    *(uint *)(dst_argb + lVar3 * 4) =
         (uVar2 & 0xff) * uVar5 + (uVar1 & 0xff) * uVar6 >> 7 |
         ((uVar2 >> 0x18) * uVar5 + (uVar1 >> 0x18) * uVar6 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar5 + (uVar1 >> 0x10 & 0xff) * uVar6) * 0x200 & 0x1ff0000 |
         ((uVar2 >> 8 & 0xff) * uVar5 + (uVar1 >> 8 & 0xff) * uVar6) * 2 & 0x1ff00;
    uVar5 = x + dx;
    uVar6 = uVar5 >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)((int)uVar5 >> 0x10) * 4);
    uVar2 = *(uint *)(src_argb + (long)((int)uVar5 >> 0x10) * 4 + 4);
    uVar7 = uVar6 ^ 0x7f;
    *(uint *)(dst_argb + lVar3 * 4 + 4) =
         (uVar2 & 0xff) * uVar6 + (uVar1 & 0xff) * uVar7 >> 7 |
         ((uVar2 >> 0x18) * uVar6 + (uVar1 >> 0x18) * uVar7 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar6 + (uVar1 >> 0x10 & 0xff) * uVar7) * 0x200 & 0x1ff0000 |
         ((uVar2 >> 8 & 0xff) * uVar6 + (uVar1 >> 8 & 0xff) * uVar7) * 2 & 0x1ff00;
    x = uVar5 + dx;
  }
  if ((dst_width & 1U) != 0) {
    uVar5 = (uint)x >> 9 & 0x7f;
    uVar1 = *(uint *)(src_argb + (long)iVar4 * 4);
    uVar2 = *(uint *)(src_argb + (long)iVar4 * 4 + 4);
    uVar6 = uVar5 ^ 0x7f;
    *(uint *)(dst_argb + lVar3 * 4) =
         (uVar2 & 0xff) * uVar5 + (uVar1 & 0xff) * uVar6 >> 7 |
         ((uVar2 >> 0x18) * uVar5 + (uVar1 >> 0x18) * uVar6 & 0xffffff80) << 0x11 |
         ((uVar2 >> 0x10 & 0xff) * uVar5 + (uVar1 >> 0x10 & 0xff) * uVar6 & 0xff80) << 9 |
         ((uVar2 >> 8 & 0xff) * uVar5 + (uVar1 >> 8 & 0xff) * uVar6) * 2 & 0x1ff00;
  }
  return;
}

Assistant:

void ScaleARGBFilterCols_C(uint8_t* dst_argb,
                           const uint8_t* src_argb,
                           int dst_width,
                           int x,
                           int dx) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint32_t a = src[xi];
    uint32_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}